

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

void cppcms_capi_session_pool_delete(cppcms_capi_session_pool *pool)

{
  cppcms_capi_session_pool *in_RDI;
  
  if ((in_RDI != (cppcms_capi_session_pool *)0x0) && (in_RDI != (cppcms_capi_session_pool *)0x0)) {
    cppcms_capi_session_pool::~cppcms_capi_session_pool(in_RDI);
    operator_delete(in_RDI);
  }
  return;
}

Assistant:

void cppcms_capi_session_pool_delete(cppcms_capi_session_pool *pool)
{
	if(pool)
		delete pool;
}